

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall DCanvas::DrawBlock(DCanvas *this,int x,int y,int _width,int _height,BYTE *src)

{
  int iVar1;
  bool bVar2;
  BYTE *local_38;
  BYTE *dest;
  int destpitch;
  int srcpitch;
  BYTE *src_local;
  int _height_local;
  int _width_local;
  int y_local;
  int x_local;
  DCanvas *this_local;
  
  _destpitch = src;
  src_local._0_4_ = _height;
  src_local._4_4_ = _width;
  _height_local = y;
  _width_local = x;
  _y_local = this;
  bVar2 = ClipBox(this,&_width_local,&_height_local,(int *)((long)&src_local + 4),(int *)&src_local,
                  (BYTE **)&destpitch,_width);
  if (!bVar2) {
    iVar1 = this->Pitch;
    local_38 = this->Buffer + (long)_width_local + (long)(_height_local * this->Pitch);
    do {
      memcpy(local_38,_destpitch,(long)src_local._4_4_);
      _destpitch = _destpitch + _width;
      local_38 = local_38 + iVar1;
      src_local._0_4_ = (int)src_local + -1;
    } while ((int)src_local != 0);
  }
  return;
}

Assistant:

void DCanvas::DrawBlock (int x, int y, int _width, int _height, const BYTE *src) const
{
	int srcpitch = _width;
	int destpitch;
	BYTE *dest;

	if (ClipBox (x, y, _width, _height, src, srcpitch))
	{
		return;		// Nothing to draw
	}

	destpitch = Pitch;
	dest = Buffer + y*Pitch + x;

	do
	{
		memcpy (dest, src, _width);
		src += srcpitch;
		dest += destpitch;
	} while (--_height);
}